

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O0

void __thiscall QPDFLogger::setError(QPDFLogger *this,shared_ptr<Pipeline> *p)

{
  bool bVar1;
  element_type *peVar2;
  shared_ptr<Pipeline> *p_local;
  QPDFLogger *this_local;
  
  bVar1 = std::operator==(p,(nullptr_t)0x0);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::shared_ptr<Pipeline>::operator=(p,&peVar2->p_stderr);
  }
  peVar2 = std::__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<Pipeline>::operator=(&peVar2->p_error,p);
  return;
}

Assistant:

void
QPDFLogger::setError(std::shared_ptr<Pipeline> p)
{
    if (p == nullptr) {
        p = m->p_stderr;
    }
    m->p_error = p;
}